

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_uw.c
# Opt level: O0

void PrintOutput(sunrealtype t,sunrealtype y1,sunrealtype y2,sunrealtype y3)

{
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  
  printf("At t = %0.4e      y =%14.6e  %14.6e  %14.6e\n",in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa
        );
  return;
}

Assistant:

static void PrintOutput(sunrealtype t, sunrealtype y1, sunrealtype y2,
                        sunrealtype y3)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("At t = %0.4Le      y =%14.6Le  %14.6Le  %14.6Le\n", t, y1, y2, y3);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("At t = %0.4e      y =%14.6e  %14.6e  %14.6e\n", t, y1, y2, y3);
#else
  printf("At t = %0.4e      y =%14.6e  %14.6e  %14.6e\n", t, y1, y2, y3);
#endif

  return;
}